

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Specific.hh
# Opt level: O1

void avro::
     codec_traits<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testgen_r::Nested,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testgen_r::Nested>_>_>_>
     ::decode(Decoder *d,
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testgen_r::Nested,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testgen_r::Nested>_>_>
             *s)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  mapped_type *pmVar3;
  string k;
  Nested t;
  string local_88;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testgen_r::Nested,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testgen_r::Nested>_>_>
  *local_68;
  Nested local_60;
  
  local_68 = s;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testgen_r::Nested>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testgen_r::Nested>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testgen_r::Nested>_>_>
  ::clear(&s->_M_t);
  lVar2 = (**(code **)(*(long *)d + 0x98))(d);
  if (lVar2 != 0) {
    paVar1 = &local_60.inval2.field_2;
    do {
      lVar2 = lVar2 + (ulong)(lVar2 == 0);
      do {
        local_88._M_string_length = 0;
        local_88.field_2._M_local_buf[0] = '\0';
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        codec_traits<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::decode(d,&local_88);
        local_60.inval2._M_string_length = 0;
        local_60.inval2.field_2._M_local_buf[0] = '\0';
        local_60.inval1 = 0.0;
        local_60.inval3 = 0;
        local_60.inval2._M_dataplus._M_p = (pointer)paVar1;
        codec_traits<testgen_r::Nested>::decode(d,&local_60);
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testgen_r::Nested,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testgen_r::Nested>_>_>
                 ::operator[](local_68,&local_88);
        std::__cxx11::string::_M_assign((string *)pmVar3);
        pmVar3->inval3 = local_60.inval3;
        pmVar3->inval1 = local_60.inval1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60.inval2._M_dataplus._M_p != paVar1) {
          operator_delete(local_60.inval2._M_dataplus._M_p,
                          CONCAT71(local_60.inval2.field_2._M_allocated_capacity._1_7_,
                                   local_60.inval2.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,
                          CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                                   local_88.field_2._M_local_buf[0]) + 1);
        }
        lVar2 = lVar2 + -1;
      } while (lVar2 != 0);
      lVar2 = (**(code **)(*(long *)d + 0xa0))(d);
    } while (lVar2 != 0);
  }
  return;
}

Assistant:

static void decode(Decoder& d, std::map<std::string, T>& s) {
        s.clear();
        for (size_t n = d.mapStart(); n != 0; n = d.mapNext()) {
            for (size_t i = 0; i < n; ++i) {
                std::string k;
                avro::decode(d, k);
                T t;
                avro::decode(d, t);
                s[k] = t;
            }
        }
    }